

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRestruct.c
# Opt level: O0

Dec_Edge_t
Abc_NodeEvaluateDsd_rec
          (Dec_Graph_t *pGraph,Abc_ManRst_t *pManRst,Dsd_Node_t *pNodeDsd,int Required,
          int nNodesSaved,int *pnNodesAdded)

{
  DdHalfWord DVar1;
  Abc_Aig_t *pAVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  Dec_Edge_t DVar5;
  int iVar6;
  uint uVar7;
  Dec_Edge_t DVar8;
  Dec_Edge_t DVar9;
  Dsd_Node_t *p;
  DdNode *pDVar10;
  Dec_Node_t *pDVar11;
  Abc_Obj_t *pAVar12;
  Abc_Obj_t *pAVar13;
  Abc_Obj_t *local_1f8;
  Abc_Obj_t *local_1f0;
  Abc_Obj_t *local_1e8;
  Abc_Obj_t *local_190;
  Abc_Obj_t *local_188;
  Abc_Obj_t *local_158;
  Abc_Obj_t *local_140;
  Abc_Obj_t *local_138;
  DdNode *local_f8;
  DdNode *bCofE;
  DdNode *bCofT;
  DdNode *bVar;
  DdNode *bLocal;
  int local_b0;
  uint local_ac;
  int Type;
  int fCompl;
  int Index;
  int i;
  int Level4;
  int Level3;
  int Level2;
  int Level1;
  Vec_Int_t *vEdges;
  Dsd_Node_t *pDStack_80;
  Dsd_Type_t DecType;
  Dsd_Node_t *pChildDsd;
  Abc_Obj_t *pTemp;
  Abc_Obj_t *pNode4;
  Abc_Obj_t *pNode3;
  Abc_Obj_t *pNode2;
  Abc_Obj_t *pNode1;
  Dec_Edge_t local_48;
  Dec_Edge_t eQuit;
  Dec_Edge_t eResult;
  Dec_Edge_t eNode3;
  Dec_Edge_t eNode2;
  Dec_Edge_t eNode1;
  int *pnNodesAdded_local;
  int nNodesSaved_local;
  int Required_local;
  Dsd_Node_t *pNodeDsd_local;
  Abc_ManRst_t *pManRst_local;
  Dec_Graph_t *pGraph_local;
  
  pNode1._4_4_ = (Dec_Edge_t)0xfac;
  local_ac = (uint)pNodeDsd & 1;
  p = (Dsd_Node_t *)((ulong)pNodeDsd & 0xfffffffffffffffe);
  vEdges._4_4_ = Dsd_NodeReadType(p);
  if (vEdges._4_4_ == DSD_NODE_BUF) {
    pDVar10 = Dsd_NodeReadFunc(p);
    DVar1 = pDVar10->index;
    Type = DVar1;
    iVar4 = Dec_GraphLeaveNum(pGraph);
    if ((int)DVar1 < iVar4) {
      DVar5 = Dec_EdgeCreate(Type,local_ac);
      return DVar5;
    }
    __assert_fail("Index < Dec_GraphLeaveNum(pGraph)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRestruct.c"
                  ,0x261,
                  "Dec_Edge_t Abc_NodeEvaluateDsd_rec(Dec_Graph_t *, Abc_ManRst_t *, Dsd_Node_t *, int, int, int *)"
                 );
  }
  if (((vEdges._4_4_ != DSD_NODE_OR) && (vEdges._4_4_ != DSD_NODE_EXOR)) &&
     (vEdges._4_4_ != DSD_NODE_PRIME)) {
    __assert_fail("DecType == DSD_NODE_OR || DecType == DSD_NODE_EXOR || DecType == DSD_NODE_PRIME",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRestruct.c"
                  ,0x265,
                  "Dec_Edge_t Abc_NodeEvaluateDsd_rec(Dec_Graph_t *, Abc_ManRst_t *, Dsd_Node_t *, int, int, int *)"
                 );
  }
  iVar4 = Dsd_NodeReadDecsNum(p);
  _Level2 = Vec_IntAlloc(iVar4);
  for (fCompl = 0; iVar4 = fCompl, iVar6 = Dsd_NodeReadDecsNum(p), iVar4 < iVar6;
      fCompl = fCompl + 1) {
    pDStack_80 = Dsd_NodeReadDec(p,fCompl);
    local_48 = Abc_NodeEvaluateDsd_rec(pGraph,pManRst,pDStack_80,Required,nNodesSaved,pnNodesAdded);
    pVVar3 = _Level2;
    if (((uint)local_48 >> 1 & 0x3fffffff) == ((uint)pNode1._4_4_ >> 1 & 0x3fffffff)) {
      Vec_IntFree(_Level2);
      return pNode1._4_4_;
    }
    if (vEdges._4_4_ == DSD_NODE_PRIME) {
      uVar7 = Dec_EdgeToInt(local_48);
      Vec_IntPush(pVVar3,uVar7);
    }
    else {
      uVar7 = Dec_EdgeToInt(local_48);
      Abc_NodeEdgeDsdPushOrdered(pGraph,pVVar3,uVar7);
    }
  }
  if (vEdges._4_4_ == DSD_NODE_OR) {
    iVar4 = Vec_IntSize(_Level2);
    if (iVar4 < 2) {
      __assert_fail("Vec_IntSize(vEdges) > 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRestruct.c"
                    ,0x27e,
                    "Dec_Edge_t Abc_NodeEvaluateDsd_rec(Dec_Graph_t *, Abc_ManRst_t *, Dsd_Node_t *, int, int, int *)"
                   );
    }
    do {
      iVar4 = Vec_IntSize(_Level2);
      if (iVar4 < 2) {
        uVar7 = Vec_IntPop(_Level2);
        local_48 = Dec_IntToEdge(uVar7);
        Vec_IntFree(_Level2);
        return (Dec_Edge_t)((uint)local_48 & 0xfffffffe | ((uint)local_48 & 1 ^ local_ac) & 1);
      }
      iVar4 = Vec_IntSize(_Level2);
      if (2 < iVar4) {
        Abc_NodeEdgeDsdPermute(pGraph,pManRst,_Level2,0);
      }
      uVar7 = Vec_IntPop(_Level2);
      DVar5 = Dec_IntToEdge(uVar7);
      uVar7 = Vec_IntPop(_Level2);
      DVar8 = Dec_IntToEdge(uVar7);
      pDVar11 = Dec_GraphNode(pGraph,(uint)DVar5 >> 1 & 0x3fffffff);
      pNode2 = (Abc_Obj_t *)(pDVar11->field_2).pFunc;
      pDVar11 = Dec_GraphNode(pGraph,(uint)DVar8 >> 1 & 0x3fffffff);
      pNode3 = (Abc_Obj_t *)(pDVar11->field_2).pFunc;
      if (pNode2 == (Abc_Obj_t *)0x0) {
        local_138 = (Abc_Obj_t *)0x0;
      }
      else {
        local_138 = Abc_ObjNotCond(pNode2,(uint)DVar5 & 1);
      }
      pNode2 = local_138;
      if (pNode3 == (Abc_Obj_t *)0x0) {
        local_140 = (Abc_Obj_t *)0x0;
      }
      else {
        local_140 = Abc_ObjNotCond(pNode3,(uint)DVar8 & 1);
      }
      pNode3 = local_140;
      pNode4 = (Abc_Obj_t *)0x0;
      if ((pNode2 != (Abc_Obj_t *)0x0) && (local_140 != (Abc_Obj_t *)0x0)) {
        pAVar2 = (Abc_Aig_t *)pManRst->pNtk->pManFunc;
        pAVar12 = Abc_ObjNot(pNode2);
        pAVar13 = Abc_ObjNot(pNode3);
        pNode4 = Abc_AigAndLookup(pAVar2,pAVar12,pAVar13);
        if (pNode4 == (Abc_Obj_t *)0x0) {
          local_158 = (Abc_Obj_t *)0x0;
        }
        else {
          local_158 = Abc_ObjNot(pNode4);
        }
        pNode4 = local_158;
      }
      eQuit = Dec_GraphAddNodeOr(pGraph,DVar5,DVar8);
      pDVar11 = Dec_GraphNode(pGraph,(uint)DVar5 >> 1 & 0x3fffffff);
      Level3 = *(uint *)&pDVar11->field_0x10 & 0x3fff;
      pDVar11 = Dec_GraphNode(pGraph,(uint)DVar8 >> 1 & 0x3fffffff);
      Level4 = *(uint *)&pDVar11->field_0x10 & 0x3fff;
      iVar4 = Abc_MaxInt(Level3,Level4);
      pDVar11 = Dec_GraphNode(pGraph,(uint)eQuit >> 1 & 0x3fffffff);
      *(uint *)&pDVar11->field_0x10 =
           *(uint *)&pDVar11->field_0x10 & 0xffffc000 | iVar4 + 1U & 0x3fff;
      if (pNode4 != (Abc_Obj_t *)0x0) {
        pAVar12 = Abc_ObjNotCond(pNode4,(uint)eQuit & 1);
        pDVar11 = Dec_GraphNode(pGraph,(uint)eQuit >> 1 & 0x3fffffff);
        (pDVar11->field_2).pFunc = pAVar12;
        pDVar11 = Dec_GraphNode(pGraph,(uint)eQuit >> 1 & 0x3fffffff);
        uVar7 = *(uint *)&pDVar11->field_0x10 & 0x3fff;
        i = uVar7;
        if ((Required != 1000000000) &&
           (pAVar12 = Abc_ObjRegular(pNode4), uVar7 != *(uint *)&pAVar12->field_0x14 >> 0xc)) {
          __assert_fail("Required == ABC_INFINITY || Level3 == (int)Abc_ObjRegular(pNode3)->Level",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRestruct.c"
                        ,0x29d,
                        "Dec_Edge_t Abc_NodeEvaluateDsd_rec(Dec_Graph_t *, Abc_ManRst_t *, Dsd_Node_t *, int, int, int *)"
                       );
        }
      }
      if (pNode4 == (Abc_Obj_t *)0x0) {
LAB_0030b388:
        *pnNodesAdded = *pnNodesAdded + 1;
        if (nNodesSaved < *pnNodesAdded) {
          Vec_IntFree(_Level2);
          return pNode1._4_4_;
        }
      }
      else {
        pAVar12 = Abc_ObjRegular(pNode4);
        iVar4 = Abc_NodeIsTravIdCurrent(pAVar12);
        if (iVar4 != 0) goto LAB_0030b388;
      }
      pVVar3 = _Level2;
      uVar7 = Dec_EdgeToInt(eQuit);
      Abc_NodeEdgeDsdPushOrdered(pGraph,pVVar3,uVar7);
    } while( true );
  }
  if (vEdges._4_4_ == DSD_NODE_EXOR) {
    iVar4 = Vec_IntSize(_Level2);
    if (iVar4 < 2) {
      __assert_fail("Vec_IntSize(vEdges) > 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRestruct.c"
                    ,0x2b5,
                    "Dec_Edge_t Abc_NodeEvaluateDsd_rec(Dec_Graph_t *, Abc_ManRst_t *, Dsd_Node_t *, int, int, int *)"
                   );
    }
    do {
      iVar4 = Vec_IntSize(_Level2);
      if (iVar4 < 2) {
        uVar7 = Vec_IntPop(_Level2);
        local_48 = Dec_IntToEdge(uVar7);
        Vec_IntFree(_Level2);
        return (Dec_Edge_t)((uint)local_48 & 0xfffffffe | ((uint)local_48 & 1 ^ local_ac) & 1);
      }
      iVar4 = Vec_IntSize(_Level2);
      if (2 < iVar4) {
        Abc_NodeEdgeDsdPermute(pGraph,pManRst,_Level2,1);
      }
      uVar7 = Vec_IntPop(_Level2);
      DVar5 = Dec_IntToEdge(uVar7);
      uVar7 = Vec_IntPop(_Level2);
      DVar8 = Dec_IntToEdge(uVar7);
      pDVar11 = Dec_GraphNode(pGraph,(uint)DVar5 >> 1 & 0x3fffffff);
      pNode2 = (Abc_Obj_t *)(pDVar11->field_2).pFunc;
      pDVar11 = Dec_GraphNode(pGraph,(uint)DVar8 >> 1 & 0x3fffffff);
      pNode3 = (Abc_Obj_t *)(pDVar11->field_2).pFunc;
      if (pNode2 == (Abc_Obj_t *)0x0) {
        local_188 = (Abc_Obj_t *)0x0;
      }
      else {
        local_188 = Abc_ObjNotCond(pNode2,(uint)DVar5 & 1);
      }
      pNode2 = local_188;
      if (pNode3 == (Abc_Obj_t *)0x0) {
        local_190 = (Abc_Obj_t *)0x0;
      }
      else {
        local_190 = Abc_ObjNotCond(pNode3,(uint)DVar8 & 1);
      }
      pNode3 = local_190;
      local_b0 = 0;
      pNode4 = (Abc_Obj_t *)0x0;
      if ((pNode2 != (Abc_Obj_t *)0x0) && (local_190 != (Abc_Obj_t *)0x0)) {
        pNode4 = Abc_AigXorLookup((Abc_Aig_t *)pManRst->pNtk->pManFunc,pNode2,local_190,&local_b0);
      }
      eQuit = Dec_GraphAddNodeXor(pGraph,DVar5,DVar8,local_b0);
      pDVar11 = Dec_GraphNode(pGraph,(uint)DVar5 >> 1 & 0x3fffffff);
      Level3 = *(uint *)&pDVar11->field_0x10 & 0x3fff;
      pDVar11 = Dec_GraphNode(pGraph,(uint)DVar8 >> 1 & 0x3fffffff);
      Level4 = *(uint *)&pDVar11->field_0x10 & 0x3fff;
      iVar4 = Abc_MaxInt(Level3,Level4);
      pDVar11 = Dec_GraphNode(pGraph,(uint)eQuit >> 1 & 0x3fffffff);
      *(uint *)&pDVar11->field_0x10 =
           *(uint *)&pDVar11->field_0x10 & 0xffffc000 | iVar4 + 2U & 0x3fff;
      if (pNode4 != (Abc_Obj_t *)0x0) {
        pAVar12 = Abc_ObjNotCond(pNode4,(uint)eQuit & 1);
        pDVar11 = Dec_GraphNode(pGraph,(uint)eQuit >> 1 & 0x3fffffff);
        (pDVar11->field_2).pFunc = pAVar12;
        pDVar11 = Dec_GraphNode(pGraph,(uint)eQuit >> 1 & 0x3fffffff);
        uVar7 = *(uint *)&pDVar11->field_0x10 & 0x3fff;
        i = uVar7;
        if ((Required != 1000000000) &&
           (pAVar12 = Abc_ObjRegular(pNode4), uVar7 != *(uint *)&pAVar12->field_0x14 >> 0xc)) {
          __assert_fail("Required == ABC_INFINITY || Level3 == (int)Abc_ObjRegular(pNode3)->Level",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRestruct.c"
                        ,0x2d2,
                        "Dec_Edge_t Abc_NodeEvaluateDsd_rec(Dec_Graph_t *, Abc_ManRst_t *, Dsd_Node_t *, int, int, int *)"
                       );
        }
      }
      if (pNode4 == (Abc_Obj_t *)0x0) {
LAB_0030b773:
        pAVar12 = pNode2;
        *pnNodesAdded = *pnNodesAdded + 1;
        if ((pNode2 == (Abc_Obj_t *)0x0) || (pNode3 == (Abc_Obj_t *)0x0)) {
          *pnNodesAdded = *pnNodesAdded + 2;
        }
        else if (local_b0 == 0) {
          pAVar2 = (Abc_Aig_t *)pManRst->pNtk->pManFunc;
          pAVar13 = Abc_ObjNot(pNode3);
          pChildDsd = (Dsd_Node_t *)Abc_AigAndLookup(pAVar2,pAVar12,pAVar13);
          if ((Abc_Obj_t *)pChildDsd == (Abc_Obj_t *)0x0) {
LAB_0030b809:
            *pnNodesAdded = *pnNodesAdded + 1;
          }
          else {
            pAVar12 = Abc_ObjRegular((Abc_Obj_t *)pChildDsd);
            iVar4 = Abc_NodeIsTravIdCurrent(pAVar12);
            if (iVar4 != 0) goto LAB_0030b809;
          }
          pAVar2 = (Abc_Aig_t *)pManRst->pNtk->pManFunc;
          pAVar12 = Abc_ObjNot(pNode2);
          pChildDsd = (Dsd_Node_t *)Abc_AigAndLookup(pAVar2,pAVar12,pNode3);
          if ((Abc_Obj_t *)pChildDsd != (Abc_Obj_t *)0x0) {
            pAVar12 = Abc_ObjRegular((Abc_Obj_t *)pChildDsd);
            iVar4 = Abc_NodeIsTravIdCurrent(pAVar12);
            if (iVar4 == 0) goto LAB_0030b931;
          }
          *pnNodesAdded = *pnNodesAdded + 1;
        }
        else {
          pAVar2 = (Abc_Aig_t *)pManRst->pNtk->pManFunc;
          pAVar12 = Abc_ObjNot(pNode2);
          pAVar13 = Abc_ObjNot(pNode3);
          pChildDsd = (Dsd_Node_t *)Abc_AigAndLookup(pAVar2,pAVar12,pAVar13);
          if ((Abc_Obj_t *)pChildDsd == (Abc_Obj_t *)0x0) {
LAB_0030b8db:
            *pnNodesAdded = *pnNodesAdded + 1;
          }
          else {
            pAVar12 = Abc_ObjRegular((Abc_Obj_t *)pChildDsd);
            iVar4 = Abc_NodeIsTravIdCurrent(pAVar12);
            if (iVar4 != 0) goto LAB_0030b8db;
          }
          pChildDsd = (Dsd_Node_t *)
                      Abc_AigAndLookup((Abc_Aig_t *)pManRst->pNtk->pManFunc,pNode2,pNode3);
          if ((Abc_Obj_t *)pChildDsd != (Abc_Obj_t *)0x0) {
            pAVar12 = Abc_ObjRegular((Abc_Obj_t *)pChildDsd);
            iVar4 = Abc_NodeIsTravIdCurrent(pAVar12);
            if (iVar4 == 0) goto LAB_0030b931;
          }
          *pnNodesAdded = *pnNodesAdded + 1;
        }
LAB_0030b931:
        if (nNodesSaved < *pnNodesAdded) {
          Vec_IntFree(_Level2);
          return pNode1._4_4_;
        }
      }
      else {
        pAVar12 = Abc_ObjRegular(pNode4);
        iVar4 = Abc_NodeIsTravIdCurrent(pAVar12);
        if (iVar4 != 0) goto LAB_0030b773;
      }
      pVVar3 = _Level2;
      uVar7 = Dec_EdgeToInt(eQuit);
      Abc_NodeEdgeDsdPushOrdered(pGraph,pVVar3,uVar7);
    } while( true );
  }
  if (vEdges._4_4_ != DSD_NODE_PRIME) {
    Vec_IntFree(_Level2);
    return pNode1._4_4_;
  }
  pDVar10 = Dsd_TreeGetPrimeFunction(pManRst->dd,p);
  Cudd_Ref(pDVar10);
  bCofT = *pManRst->dd->vars;
  local_f8 = Cudd_Cofactor(pManRst->dd,pDVar10,(DdNode *)((ulong)bCofT ^ 1));
  Cudd_Ref(local_f8);
  bCofE = Cudd_Cofactor(pManRst->dd,pDVar10,bCofT);
  Cudd_Ref(bCofE);
  iVar4 = Extra_bddIsVar(local_f8);
  if ((iVar4 == 0) || (iVar4 = Extra_bddIsVar(bCofE), iVar4 == 0)) {
    Cudd_RecursiveDeref(pManRst->dd,local_f8);
    Cudd_RecursiveDeref(pManRst->dd,bCofE);
    bCofT = pManRst->dd->vars[1];
    local_f8 = Cudd_Cofactor(pManRst->dd,pDVar10,(DdNode *)((ulong)bCofT ^ 1));
    Cudd_Ref(local_f8);
    bCofE = Cudd_Cofactor(pManRst->dd,pDVar10,bCofT);
    Cudd_Ref(bCofE);
    iVar4 = Extra_bddIsVar(local_f8);
    if ((iVar4 == 0) || (iVar4 = Extra_bddIsVar(bCofE), iVar4 == 0)) {
      Cudd_RecursiveDeref(pManRst->dd,local_f8);
      Cudd_RecursiveDeref(pManRst->dd,bCofE);
      bCofT = pManRst->dd->vars[2];
      local_f8 = Cudd_Cofactor(pManRst->dd,pDVar10,(DdNode *)((ulong)bCofT ^ 1));
      Cudd_Ref(local_f8);
      bCofE = Cudd_Cofactor(pManRst->dd,pDVar10,bCofT);
      Cudd_Ref(bCofE);
      iVar4 = Extra_bddIsVar(local_f8);
      if ((iVar4 == 0) || (iVar4 = Extra_bddIsVar(bCofE), iVar4 == 0)) {
        Cudd_RecursiveDeref(pManRst->dd,local_f8);
        Cudd_RecursiveDeref(pManRst->dd,bCofE);
        Cudd_RecursiveDeref(pManRst->dd,pDVar10);
        Vec_IntFree(_Level2);
        return pNode1._4_4_;
      }
    }
  }
  Cudd_RecursiveDeref(pManRst->dd,pDVar10);
  uVar7 = Vec_IntEntry(_Level2,bCofT->index);
  DVar5 = Dec_IntToEdge(uVar7);
  uVar7 = Vec_IntEntry(_Level2,*(int *)((ulong)bCofE & 0xfffffffffffffffe));
  DVar8 = Dec_IntToEdge(uVar7);
  uVar7 = Vec_IntEntry(_Level2,*(int *)((ulong)local_f8 & 0xfffffffffffffffe));
  DVar9 = Dec_IntToEdge(uVar7);
  uVar7 = (uint)DVar8 & 1 ^ (uint)bCofE & 1;
  eQuit = (Dec_Edge_t)((uint)DVar9 & 0xfffffffe | (uint)DVar9 & 1 ^ (uint)local_f8 & 1);
  Cudd_RecursiveDeref(pManRst->dd,local_f8);
  Cudd_RecursiveDeref(pManRst->dd,bCofE);
  pDVar11 = Dec_GraphNode(pGraph,(uint)DVar5 >> 1 & 0x3fffffff);
  pNode2 = (Abc_Obj_t *)(pDVar11->field_2).pFunc;
  pDVar11 = Dec_GraphNode(pGraph,((uint)DVar8 & 0x7ffffffe) >> 1);
  pNode3 = (Abc_Obj_t *)(pDVar11->field_2).pFunc;
  pDVar11 = Dec_GraphNode(pGraph,(uint)eQuit >> 1 & 0x3fffffff);
  pNode4 = (Abc_Obj_t *)(pDVar11->field_2).pFunc;
  if (pNode2 == (Abc_Obj_t *)0x0) {
    local_1e8 = (Abc_Obj_t *)0x0;
  }
  else {
    local_1e8 = Abc_ObjNotCond(pNode2,(uint)DVar5 & 1);
  }
  pNode2 = local_1e8;
  if (pNode3 == (Abc_Obj_t *)0x0) {
    local_1f0 = (Abc_Obj_t *)0x0;
  }
  else {
    local_1f0 = Abc_ObjNotCond(pNode3,uVar7);
  }
  pNode3 = local_1f0;
  if (pNode4 == (Abc_Obj_t *)0x0) {
    local_1f8 = (Abc_Obj_t *)0x0;
  }
  else {
    local_1f8 = Abc_ObjNotCond(pNode4,(uint)eQuit & 1);
  }
  pNode4 = local_1f8;
  local_b0 = 0;
  pTemp = (Abc_Obj_t *)0x0;
  if (((pNode2 != (Abc_Obj_t *)0x0) && (pNode3 != (Abc_Obj_t *)0x0)) &&
     (local_1f8 != (Abc_Obj_t *)0x0)) {
    pTemp = Abc_AigMuxLookup((Abc_Aig_t *)pManRst->pNtk->pManFunc,pNode2,pNode3,local_1f8,&local_b0)
    ;
  }
  local_48 = Dec_GraphAddNodeMux(pGraph,DVar5,(Dec_Edge_t)((uint)DVar8 & 0xfffffffe | uVar7),eQuit,
                                 local_b0);
  pDVar11 = Dec_GraphNode(pGraph,(uint)DVar5 >> 1 & 0x3fffffff);
  Level3 = *(uint *)&pDVar11->field_0x10 & 0x3fff;
  pDVar11 = Dec_GraphNode(pGraph,((uint)DVar8 & 0x7ffffffe) >> 1);
  Level4 = *(uint *)&pDVar11->field_0x10 & 0x3fff;
  pDVar11 = Dec_GraphNode(pGraph,(uint)eQuit >> 1 & 0x3fffffff);
  i = *(uint *)&pDVar11->field_0x10 & 0x3fff;
  iVar4 = Abc_MaxInt(Level3,Level4);
  iVar4 = Abc_MaxInt(iVar4,i);
  pDVar11 = Dec_GraphNode(pGraph,(uint)local_48 >> 1 & 0x3fffffff);
  *(uint *)&pDVar11->field_0x10 = *(uint *)&pDVar11->field_0x10 & 0xffffc000 | iVar4 + 2U & 0x3fff;
  if (pTemp != (Abc_Obj_t *)0x0) {
    pAVar12 = Abc_ObjNotCond(pTemp,(uint)local_48 & 1);
    pDVar11 = Dec_GraphNode(pGraph,(uint)local_48 >> 1 & 0x3fffffff);
    (pDVar11->field_2).pFunc = pAVar12;
    pDVar11 = Dec_GraphNode(pGraph,(uint)local_48 >> 1 & 0x3fffffff);
    uVar7 = *(uint *)&pDVar11->field_0x10 & 0x3fff;
    Index = uVar7;
    if ((Required != 1000000000) &&
       (pAVar12 = Abc_ObjRegular(pTemp), uVar7 != *(uint *)&pAVar12->field_0x14 >> 0xc)) {
      __assert_fail("Required == ABC_INFINITY || Level4 == (int)Abc_ObjRegular(pNode4)->Level",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRestruct.c"
                    ,0x346,
                    "Dec_Edge_t Abc_NodeEvaluateDsd_rec(Dec_Graph_t *, Abc_ManRst_t *, Dsd_Node_t *, int, int, int *)"
                   );
    }
  }
  if (pTemp != (Abc_Obj_t *)0x0) {
    pAVar12 = Abc_ObjRegular(pTemp);
    iVar4 = Abc_NodeIsTravIdCurrent(pAVar12);
    if (iVar4 == 0) goto LAB_0030c2c7;
  }
  pAVar12 = pNode2;
  *pnNodesAdded = *pnNodesAdded + 1;
  if (local_b0 == 0) {
    if ((pNode2 == (Abc_Obj_t *)0x0) || (pNode3 == (Abc_Obj_t *)0x0)) {
      *pnNodesAdded = *pnNodesAdded + 1;
    }
    else {
      pChildDsd = (Dsd_Node_t *)Abc_AigAndLookup((Abc_Aig_t *)pManRst->pNtk->pManFunc,pNode2,pNode3)
      ;
      if ((Abc_Obj_t *)pChildDsd != (Abc_Obj_t *)0x0) {
        pAVar12 = Abc_ObjRegular((Abc_Obj_t *)pChildDsd);
        iVar4 = Abc_NodeIsTravIdCurrent(pAVar12);
        if (iVar4 == 0) goto LAB_0030c110;
      }
      *pnNodesAdded = *pnNodesAdded + 1;
    }
LAB_0030c110:
    if ((pNode2 == (Abc_Obj_t *)0x0) || (pNode4 == (Abc_Obj_t *)0x0)) {
      *pnNodesAdded = *pnNodesAdded + 1;
    }
    else {
      pAVar2 = (Abc_Aig_t *)pManRst->pNtk->pManFunc;
      pAVar12 = Abc_ObjNot(pNode2);
      pChildDsd = (Dsd_Node_t *)Abc_AigAndLookup(pAVar2,pAVar12,pNode4);
      if ((Abc_Obj_t *)pChildDsd != (Abc_Obj_t *)0x0) {
        pAVar12 = Abc_ObjRegular((Abc_Obj_t *)pChildDsd);
        iVar4 = Abc_NodeIsTravIdCurrent(pAVar12);
        if (iVar4 == 0) goto LAB_0030c2a6;
      }
      *pnNodesAdded = *pnNodesAdded + 1;
    }
  }
  else {
    if ((pNode2 == (Abc_Obj_t *)0x0) || (pNode3 == (Abc_Obj_t *)0x0)) {
      *pnNodesAdded = *pnNodesAdded + 1;
    }
    else {
      pAVar2 = (Abc_Aig_t *)pManRst->pNtk->pManFunc;
      pAVar13 = Abc_ObjNot(pNode3);
      pChildDsd = (Dsd_Node_t *)Abc_AigAndLookup(pAVar2,pAVar12,pAVar13);
      if ((Abc_Obj_t *)pChildDsd != (Abc_Obj_t *)0x0) {
        pAVar12 = Abc_ObjRegular((Abc_Obj_t *)pChildDsd);
        iVar4 = Abc_NodeIsTravIdCurrent(pAVar12);
        if (iVar4 == 0) goto LAB_0030c217;
      }
      *pnNodesAdded = *pnNodesAdded + 1;
    }
LAB_0030c217:
    if ((pNode2 == (Abc_Obj_t *)0x0) || (pNode4 == (Abc_Obj_t *)0x0)) {
      *pnNodesAdded = *pnNodesAdded + 1;
    }
    else {
      pAVar2 = (Abc_Aig_t *)pManRst->pNtk->pManFunc;
      pAVar12 = Abc_ObjNot(pNode2);
      pAVar13 = Abc_ObjNot(pNode4);
      pChildDsd = (Dsd_Node_t *)Abc_AigAndLookup(pAVar2,pAVar12,pAVar13);
      if ((Abc_Obj_t *)pChildDsd != (Abc_Obj_t *)0x0) {
        pAVar12 = Abc_ObjRegular((Abc_Obj_t *)pChildDsd);
        iVar4 = Abc_NodeIsTravIdCurrent(pAVar12);
        if (iVar4 == 0) goto LAB_0030c2a6;
      }
      *pnNodesAdded = *pnNodesAdded + 1;
    }
  }
LAB_0030c2a6:
  if (nNodesSaved < *pnNodesAdded) {
    Vec_IntFree(_Level2);
    return pNode1._4_4_;
  }
LAB_0030c2c7:
  Vec_IntFree(_Level2);
  return (Dec_Edge_t)((uint)local_48 & 0xfffffffe | ((uint)local_48 & 1 ^ local_ac) & 1);
}

Assistant:

Dec_Edge_t Abc_NodeEvaluateDsd_rec( Dec_Graph_t * pGraph, Abc_ManRst_t * pManRst, Dsd_Node_t * pNodeDsd, int Required, int nNodesSaved, int * pnNodesAdded )
{
    Dec_Edge_t eNode1, eNode2, eNode3, eResult, eQuit = { 0, 2006 };
    Abc_Obj_t * pNode1, * pNode2, * pNode3, * pNode4, * pTemp;
    Dsd_Node_t * pChildDsd;
    Dsd_Type_t DecType;
    Vec_Int_t * vEdges;
    int Level1, Level2, Level3, Level4;
    int i, Index, fCompl, Type;

    // remove the complemented attribute
    fCompl   = Dsd_IsComplement( pNodeDsd );
    pNodeDsd = Dsd_Regular( pNodeDsd );

    // consider the trivial case
    DecType = Dsd_NodeReadType( pNodeDsd );
    if ( DecType == DSD_NODE_BUF )
    {
        Index = Dsd_NodeReadFunc(pNodeDsd)->index;
        assert( Index < Dec_GraphLeaveNum(pGraph) );
        eResult = Dec_EdgeCreate( Index, fCompl );
        return eResult;
    }
    assert( DecType == DSD_NODE_OR || DecType == DSD_NODE_EXOR || DecType == DSD_NODE_PRIME );

    // solve the problem for the children
    vEdges = Vec_IntAlloc( Dsd_NodeReadDecsNum(pNodeDsd) );
    Dsd_NodeForEachChild( pNodeDsd, i, pChildDsd )
    {
        eResult = Abc_NodeEvaluateDsd_rec( pGraph, pManRst, pChildDsd, Required, nNodesSaved, pnNodesAdded );
        if ( eResult.Node == eQuit.Node ) // infeasible
        {
            Vec_IntFree( vEdges );
            return eQuit;
        }
        // order the inputs only if this is OR or EXOR
        if ( DecType == DSD_NODE_PRIME )
            Vec_IntPush( vEdges, Dec_EdgeToInt(eResult) );
        else
            Abc_NodeEdgeDsdPushOrdered( pGraph, vEdges, Dec_EdgeToInt(eResult) );
    }
    // the edges are sorted by the level of their nodes in decreasing order


    // consider special cases
    if ( DecType == DSD_NODE_OR )
    {
        // try to balance the nodes by delay
        assert( Vec_IntSize(vEdges) > 1 );
        while ( Vec_IntSize(vEdges) > 1 )
        {
            // permute the last two entries
            if ( Vec_IntSize(vEdges) > 2 )
                Abc_NodeEdgeDsdPermute( pGraph, pManRst, vEdges, 0 );
            // get the two last nodes
            eNode1 = Dec_IntToEdge( Vec_IntPop(vEdges) );
            eNode2 = Dec_IntToEdge( Vec_IntPop(vEdges) );
            pNode1 = (Abc_Obj_t *)Dec_GraphNode( pGraph, eNode1.Node )->pFunc;
            pNode2 = (Abc_Obj_t *)Dec_GraphNode( pGraph, eNode2.Node )->pFunc;
            pNode1 = !pNode1? NULL : Abc_ObjNotCond( pNode1, eNode1.fCompl );
            pNode2 = !pNode2? NULL : Abc_ObjNotCond( pNode2, eNode2.fCompl );
            // check if the new node exists
            pNode3 = NULL;
            if ( pNode1 && pNode2 )
            {
                pNode3 = Abc_AigAndLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, Abc_ObjNot(pNode1), Abc_ObjNot(pNode2) ); 
                pNode3 = !pNode3? NULL : Abc_ObjNot(pNode3);
            }
            // create the new node
            eNode3 = Dec_GraphAddNodeOr( pGraph, eNode1, eNode2 );
            // set level
            Level1 = Dec_GraphNode( pGraph, eNode1.Node )->Level;
            Level2 = Dec_GraphNode( pGraph, eNode2.Node )->Level;
            Dec_GraphNode( pGraph, eNode3.Node )->Level = 1 + Abc_MaxInt(Level1, Level2);
            // get the new node if possible
            if ( pNode3 )
            {
                Dec_GraphNode( pGraph, eNode3.Node )->pFunc = Abc_ObjNotCond(pNode3, eNode3.fCompl);
                Level3 = Dec_GraphNode( pGraph, eNode3.Node )->Level;
                assert( Required == ABC_INFINITY || Level3 == (int)Abc_ObjRegular(pNode3)->Level );
            }
            if ( !pNode3 || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pNode3)) )
            {
                (*pnNodesAdded)++;
                if ( *pnNodesAdded > nNodesSaved )
                {
                    Vec_IntFree( vEdges );
                    return eQuit;
                }
            }
            // add the resulting node to the form
            Abc_NodeEdgeDsdPushOrdered( pGraph, vEdges, Dec_EdgeToInt(eNode3) );
        }
        // get the last node
        eResult = Dec_IntToEdge( Vec_IntPop(vEdges) );
        Vec_IntFree( vEdges );
        // complement the graph if the node was complemented
        eResult.fCompl ^= fCompl;
        return eResult;
    }
    if ( DecType == DSD_NODE_EXOR )
    {
        // try to balance the nodes by delay
        assert( Vec_IntSize(vEdges) > 1 );
        while ( Vec_IntSize(vEdges) > 1 )
        {
            // permute the last two entries
            if ( Vec_IntSize(vEdges) > 2 )
                Abc_NodeEdgeDsdPermute( pGraph, pManRst, vEdges, 1 );
            // get the two last nodes
            eNode1 = Dec_IntToEdge( Vec_IntPop(vEdges) );
            eNode2 = Dec_IntToEdge( Vec_IntPop(vEdges) );
            pNode1 = (Abc_Obj_t *)Dec_GraphNode( pGraph, eNode1.Node )->pFunc;
            pNode2 = (Abc_Obj_t *)Dec_GraphNode( pGraph, eNode2.Node )->pFunc;
            pNode1 = !pNode1? NULL : Abc_ObjNotCond( pNode1, eNode1.fCompl );
            pNode2 = !pNode2? NULL : Abc_ObjNotCond( pNode2, eNode2.fCompl );
            // check if the new node exists
            Type = 0;
            pNode3 = NULL;
            if ( pNode1 && pNode2 )
                pNode3 = Abc_AigXorLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, pNode1, pNode2, &Type ); 
            // create the new node
            eNode3 = Dec_GraphAddNodeXor( pGraph, eNode1, eNode2, Type ); // should have the same structure as in AIG
            // set level
            Level1 = Dec_GraphNode( pGraph, eNode1.Node )->Level;
            Level2 = Dec_GraphNode( pGraph, eNode2.Node )->Level;
            Dec_GraphNode( pGraph, eNode3.Node )->Level = 2 + Abc_MaxInt(Level1, Level2);
            // get the new node if possible
            if ( pNode3 )
            {
                Dec_GraphNode( pGraph, eNode3.Node )->pFunc = Abc_ObjNotCond(pNode3, eNode3.fCompl);
                Level3 = Dec_GraphNode( pGraph, eNode3.Node )->Level;
                assert( Required == ABC_INFINITY || Level3 == (int)Abc_ObjRegular(pNode3)->Level );
            }
            if ( !pNode3 || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pNode3)) )
            {
                (*pnNodesAdded)++;
                if ( !pNode1 || !pNode2 )
                    (*pnNodesAdded) += 2;
                else if ( Type == 0 )
                {
                    pTemp = Abc_AigAndLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, pNode1, Abc_ObjNot(pNode2) );
                    if ( !pTemp || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pTemp)) )
                        (*pnNodesAdded)++;
                    pTemp = Abc_AigAndLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, Abc_ObjNot(pNode1), pNode2 );
                    if ( !pTemp || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pTemp)) )
                        (*pnNodesAdded)++;
                }
                else
                {
                    pTemp = Abc_AigAndLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, Abc_ObjNot(pNode1), Abc_ObjNot(pNode2) );
                    if ( !pTemp || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pTemp)) )
                        (*pnNodesAdded)++;
                    pTemp = Abc_AigAndLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, pNode1, pNode2 );
                    if ( !pTemp || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pTemp)) )
                        (*pnNodesAdded)++;
                }
                if ( *pnNodesAdded > nNodesSaved )
                {
                    Vec_IntFree( vEdges );
                    return eQuit;
                }
            }
            // add the resulting node to the form
            Abc_NodeEdgeDsdPushOrdered( pGraph, vEdges, Dec_EdgeToInt(eNode3) );
        }
        // get the last node
        eResult = Dec_IntToEdge( Vec_IntPop(vEdges) );
        Vec_IntFree( vEdges );
        // complement the graph if the node is complemented
        eResult.fCompl ^= fCompl;
        return eResult;
    }
    if ( DecType == DSD_NODE_PRIME )
    {
        DdNode * bLocal, * bVar, * bCofT, * bCofE;
        bLocal = Dsd_TreeGetPrimeFunction( pManRst->dd, pNodeDsd );  Cudd_Ref( bLocal );
//Extra_bddPrint( pManRst->dd, bLocal );

        bVar  = pManRst->dd->vars[0];
        bCofE = Cudd_Cofactor( pManRst->dd, bLocal, Cudd_Not(bVar) );  Cudd_Ref( bCofE );
        bCofT = Cudd_Cofactor( pManRst->dd, bLocal, bVar );            Cudd_Ref( bCofT );
        if ( !Extra_bddIsVar(bCofE) || !Extra_bddIsVar(bCofT) )
        {
            Cudd_RecursiveDeref( pManRst->dd, bCofE );
            Cudd_RecursiveDeref( pManRst->dd, bCofT );
            bVar  = pManRst->dd->vars[1];
            bCofE = Cudd_Cofactor( pManRst->dd, bLocal, Cudd_Not(bVar) );  Cudd_Ref( bCofE );
            bCofT = Cudd_Cofactor( pManRst->dd, bLocal, bVar );            Cudd_Ref( bCofT );
            if ( !Extra_bddIsVar(bCofE) || !Extra_bddIsVar(bCofT) )
            {
                Cudd_RecursiveDeref( pManRst->dd, bCofE );
                Cudd_RecursiveDeref( pManRst->dd, bCofT );
                bVar  = pManRst->dd->vars[2];
                bCofE = Cudd_Cofactor( pManRst->dd, bLocal, Cudd_Not(bVar) );  Cudd_Ref( bCofE );
                bCofT = Cudd_Cofactor( pManRst->dd, bLocal, bVar );            Cudd_Ref( bCofT );
                if ( !Extra_bddIsVar(bCofE) || !Extra_bddIsVar(bCofT) )
                {
                    Cudd_RecursiveDeref( pManRst->dd, bCofE );
                    Cudd_RecursiveDeref( pManRst->dd, bCofT );
                    Cudd_RecursiveDeref( pManRst->dd, bLocal );
                    Vec_IntFree( vEdges );
                    return eQuit;
                }
            }
        }
        Cudd_RecursiveDeref( pManRst->dd, bLocal );
        // we found the control variable (bVar) and the var-cofactors (bCofT, bCofE)

        // find the graph nodes
        eNode1 = Dec_IntToEdge( Vec_IntEntry(vEdges, bVar->index) );
        eNode2 = Dec_IntToEdge( Vec_IntEntry(vEdges, Cudd_Regular(bCofT)->index) );
        eNode3 = Dec_IntToEdge( Vec_IntEntry(vEdges, Cudd_Regular(bCofE)->index) );
        // add the complements to the graph nodes
        eNode2.fCompl ^= Cudd_IsComplement(bCofT);
        eNode3.fCompl ^= Cudd_IsComplement(bCofE);

        // because the cofactors are vars, we can just as well deref them here
        Cudd_RecursiveDeref( pManRst->dd, bCofE );
        Cudd_RecursiveDeref( pManRst->dd, bCofT );

        // find the ABC nodes
        pNode1 = (Abc_Obj_t *)Dec_GraphNode( pGraph, eNode1.Node )->pFunc;
        pNode2 = (Abc_Obj_t *)Dec_GraphNode( pGraph, eNode2.Node )->pFunc;
        pNode3 = (Abc_Obj_t *)Dec_GraphNode( pGraph, eNode3.Node )->pFunc;
        pNode1 = !pNode1? NULL : Abc_ObjNotCond( pNode1, eNode1.fCompl );
        pNode2 = !pNode2? NULL : Abc_ObjNotCond( pNode2, eNode2.fCompl );
        pNode3 = !pNode3? NULL : Abc_ObjNotCond( pNode3, eNode3.fCompl );

        // check if the new node exists
        Type = 0;
        pNode4 = NULL;
        if ( pNode1 && pNode2 && pNode3 )
            pNode4 = Abc_AigMuxLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, pNode1, pNode2, pNode3, &Type ); 

        // create the new node
        eResult = Dec_GraphAddNodeMux( pGraph, eNode1, eNode2, eNode3, Type ); // should have the same structure as AIG

        // set level
        Level1 = Dec_GraphNode( pGraph, eNode1.Node )->Level;
        Level2 = Dec_GraphNode( pGraph, eNode2.Node )->Level;
        Level3 = Dec_GraphNode( pGraph, eNode3.Node )->Level;
        Dec_GraphNode( pGraph, eResult.Node )->Level = 2 + Abc_MaxInt( Abc_MaxInt(Level1, Level2), Level3 );
        // get the new node if possible
        if ( pNode4 )
        {
            Dec_GraphNode( pGraph, eResult.Node )->pFunc = Abc_ObjNotCond(pNode4, eResult.fCompl);
            Level4 = Dec_GraphNode( pGraph, eResult.Node )->Level;
            assert( Required == ABC_INFINITY || Level4 == (int)Abc_ObjRegular(pNode4)->Level );
        }
        if ( !pNode4 || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pNode4)) )
        {
            (*pnNodesAdded)++;
            if ( Type == 0 ) 
            {
                if ( !pNode1 || !pNode2 )
                    (*pnNodesAdded)++;
                else
                {
                    pTemp = Abc_AigAndLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, pNode1, pNode2 );
                    if ( !pTemp || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pTemp)) )
                        (*pnNodesAdded)++;
                }
                if ( !pNode1 || !pNode3 )
                    (*pnNodesAdded)++;
                else
                {
                    pTemp = Abc_AigAndLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, Abc_ObjNot(pNode1), pNode3 );
                    if ( !pTemp || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pTemp)) )
                        (*pnNodesAdded)++;
                }
            }
            else
            {
                if ( !pNode1 || !pNode2 )
                    (*pnNodesAdded)++;
                else
                {
                    pTemp = Abc_AigAndLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, pNode1, Abc_ObjNot(pNode2) );
                    if ( !pTemp || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pTemp)) )
                        (*pnNodesAdded)++;
                }
                if ( !pNode1 || !pNode3 )
                    (*pnNodesAdded)++;
                else
                {
                    pTemp = Abc_AigAndLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, Abc_ObjNot(pNode1), Abc_ObjNot(pNode3) );
                    if ( !pTemp || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pTemp)) )
                        (*pnNodesAdded)++;
                }
            }
            if ( *pnNodesAdded > nNodesSaved )
            {
                Vec_IntFree( vEdges );
                return eQuit;
            }
        }

        Vec_IntFree( vEdges );
        // complement the graph if the node was complemented
        eResult.fCompl ^= fCompl;
        return eResult;
    }
    Vec_IntFree( vEdges );
    return eQuit;
}